

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

size_type cmSystemToolsFindRPath(string_view *have,string_view *want)

{
  bool bVar1;
  size_type sVar2;
  ulong __pos;
  ulong uVar3;
  size_type unaff_R12;
  
  __pos = 0;
  do {
    if (have->_M_len <= __pos) {
      return 0xffffffffffffffff;
    }
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (have,want->_M_str,__pos,want->_M_len);
    if ((sVar2 == 0xffffffffffffffff) ||
       (((sVar2 == 0 || (have->_M_str[sVar2 - 1] == ':')) &&
        ((uVar3 = want->_M_len + sVar2, have->_M_len <= uVar3 || (have->_M_str[uVar3] == ':')))))) {
      bVar1 = false;
      unaff_R12 = sVar2;
    }
    else {
      __pos = sVar2 + 1;
      bVar1 = true;
    }
  } while (bVar1);
  return unaff_R12;
}

Assistant:

static std::string::size_type cmSystemToolsFindRPath(
  cm::string_view const& have, cm::string_view const& want)
{
  std::string::size_type pos = 0;
  while (pos < have.size()) {
    // Look for an occurrence of the string.
    std::string::size_type const beg = have.find(want, pos);
    if (beg == std::string::npos) {
      return std::string::npos;
    }

    // Make sure it is separated from preceding entries.
    if (beg > 0 && have[beg - 1] != ':') {
      pos = beg + 1;
      continue;
    }

    // Make sure it is separated from following entries.
    std::string::size_type const end = beg + want.size();
    if (end < have.size() && have[end] != ':') {
      pos = beg + 1;
      continue;
    }

    // Return the position of the path portion.
    return beg;
  }

  // The desired rpath was not found.
  return std::string::npos;
}